

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O1

void __thiscall
test_matrix_dense_scalar_matrix_division_assignment_Test::TestBody
          (test_matrix_dense_scalar_matrix_division_assignment_Test *this)

{
  void *pvVar1;
  double *pdVar2;
  pointer pVVar3;
  long lVar4;
  Vector_Dense<double,_0UL> *element;
  Vector_Dense<double,_0UL> *pVVar5;
  pointer *__ptr;
  double *element_1;
  undefined8 *puVar6;
  double *pdVar7;
  Vector_Dense<double,_0UL> *pVVar8;
  char *pcVar9;
  long lVar10;
  byte bVar11;
  AssertionResult gtest_ar;
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_168;
  undefined1 *puStack_160;
  undefined1 *local_158;
  AssertHelper local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  double local_118;
  Vector_Dense<double,_3UL> local_110;
  Vector_Dense<double,_3UL> local_f8;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_d8;
  Vector_Dense<double,_0UL> local_c0;
  Vector_Dense<double,_0UL> local_a8;
  Vector_Dense<double,_0UL> local_90;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> local_78;
  undefined8 local_68;
  initializer_list<double> local_60;
  initializer_list<double> local_50;
  initializer_list<double> local_40;
  
  bVar11 = 0;
  local_40._M_array = (iterator)local_128;
  local_128 = (undefined1  [8])0x3ff0000000000000;
  pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x4000000000000000;
  local_118 = 3.0;
  local_40._M_len = 3;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_c0,&local_40);
  local_168._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4010000000000000
  ;
  puStack_160 = (undefined1 *)0x4014000000000000;
  local_158 = (undefined1 *)0x4018000000000000;
  local_50._M_len = 3;
  local_50._M_array = (iterator)&local_168;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_a8,&local_50);
  local_148.data_ = (AssertHelperData *)&DAT_401c000000000000;
  uStack_140 = 0x4020000000000000;
  local_138 = 0x4022000000000000;
  local_60._M_len = 3;
  local_60._M_array = (iterator)&local_148;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_90,&local_60);
  pVVar5 = &local_c0;
  local_78._M_len = 3;
  local_78._M_array = pVVar5;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_d8,&local_78);
  lVar10 = 0x48;
  do {
    pvVar1 = *(void **)((long)&local_d8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar10);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_d8.
                                              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar10) - (long)pvVar1);
    }
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != 0);
  local_168._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4024000000000000
  ;
  puStack_160 = &DAT_4034000000000000;
  local_158 = &DAT_403e000000000000;
  local_40._M_len = 3;
  local_40._M_array = (iterator)&local_168;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense((Vector_Dense<double,_3UL> *)local_128,&local_40);
  local_148.data_ = (AssertHelperData *)&DAT_4044000000000000;
  uStack_140 = 0x4049000000000000;
  local_138 = 0x404e000000000000;
  local_50._M_len = 3;
  local_50._M_array = (iterator)&local_148;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_110,&local_50);
  local_78._M_array = (iterator)0x4051800000000000;
  local_78._M_len = 0x4054000000000000;
  local_68 = 0x4056800000000000;
  local_60._M_len = 3;
  local_60._M_array = (iterator)&local_78;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_f8,&local_60);
  puVar6 = (undefined8 *)local_128;
  pVVar8 = pVVar5;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pVVar8->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)*puVar6;
    puVar6 = puVar6 + (ulong)bVar11 * -2 + 1;
    pVVar8 = (Vector_Dense<double,_0UL> *)((long)pVVar8 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  lVar10 = 0;
  do {
    lVar4 = 0;
    do {
      *(double *)
       ((long)&(pVVar5->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar4) =
           *(double *)
            ((long)&(pVVar5->super_vector<double,_std::allocator<double>_>).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar4) / -10.0;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    lVar10 = lVar10 + 0x18;
    pVVar5 = pVVar5 + 1;
  } while (lVar10 != 0x48);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[0][0]","static_matrix[0][0]",
             -*((local_d8.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x95,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[0][1]","static_matrix[0][1]",
             -((local_d8.
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[1],
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x96,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[0][2]","static_matrix[0][2]",
             -((local_d8.
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[2],
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x97,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[1][0]","static_matrix[1][0]",
             -*local_d8.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x98,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[1][1]","static_matrix[1][1]",
             -local_d8.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[1],
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x99,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[1][2]","static_matrix[1][2]",
             -local_d8.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[2],
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x9a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[2][0]","static_matrix[2][0]",
             -*local_d8.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].
               super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x9b,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[2][1]","static_matrix[2][1]",
             -local_d8.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[1],
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x9c,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"-1.0 * dynamic_matrix[2][2]","static_matrix[2][2]",
             -local_d8.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[2],
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x9d,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  pVVar3 = local_d8.
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
    pVVar3 = local_d8.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; pVVar3 != local_d8.
                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    pdVar2 = (pVVar3->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (pdVar7 = (pVVar3->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar7 != pdVar2; pdVar7 = pdVar7 + 1) {
      *pdVar7 = *pdVar7 / 0.1;
    }
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[0][0]","-10.0 * static_matrix[0][0]",
             **(double **)
               local_d8.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa0,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[0][1]","-10.0 * static_matrix[0][1]",
             ((local_d8.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa1,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[0][2]","-10.0 * static_matrix[0][2]",
             ((local_d8.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa2,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[1][0]","-10.0 * static_matrix[1][0]",
             *local_d8.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa3,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[1][1]","-10.0 * static_matrix[1][1]",
             local_d8.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa4,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[1][2]","-10.0 * static_matrix[1][2]",
             local_d8.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa5,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[2][0]","-10.0 * static_matrix[2][0]",
             *local_d8.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa6,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[2][1]","-10.0 * static_matrix[2][1]",
             local_d8.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa7,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"dynamic_matrix[2][2]","-10.0 * static_matrix[2][2]",
             local_d8.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage * -10.0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa8,pcVar9);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_d8);
  return;
}

Assistant:

TEST(test_matrix_dense, scalar_matrix_division_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  Matrix_Dense<Scalar, 3, 3> static_matrix = {{10, 20, 30}, {40, 50, 60}, {70, 80, 90}};

  static_matrix /= -10.0;
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][0], static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][1], static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][2], static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][0], static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][1], static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][2], static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][0], static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][1], static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][2], static_matrix[2][2]);

  dynamic_matrix /= 0.1;
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], -10.0 * static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], -10.0 * static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][2], -10.0 * static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], -10.0 * static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], -10.0 * static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][2], -10.0 * static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][0], -10.0 * static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][1], -10.0 * static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][2], -10.0 * static_matrix[2][2]);
}